

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::peer_connection::announce_piece(peer_connection *this,piece_index_t index)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])();
  if ((char)iVar2 == '\0') {
    bVar1 = session_settings::get_bool((this->super_peer_connection_hot_members).m_settings,0x8002);
    if (!bVar1) {
      bVar1 = has_piece(this,index);
      if (bVar1) {
        peer_log(this,outgoing_message,"HAVE","piece: %d SUPPRESSED",index.m_val);
        return;
      }
    }
    bVar1 = disconnect_if_redundant(this);
    if (!bVar1) {
      peer_log(this,outgoing_message,"HAVE","piece: %d",index.m_val);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x25])(this,index.m_val);
      return;
    }
  }
  return;
}

Assistant:

void peer_connection::announce_piece(piece_index_t const index)
	{
		TORRENT_ASSERT(is_single_thread());
		// dont announce during handshake
		if (in_handshake()) return;

		// optimization, don't send have messages
		// to peers that already have the piece
		if (!m_settings.get_bool(settings_pack::send_redundant_have)
			&& has_piece(index))
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::outgoing_message, "HAVE", "piece: %d SUPPRESSED"
				, static_cast<int>(index));
#endif
			return;
		}

		if (disconnect_if_redundant()) return;

#ifndef TORRENT_DISABLE_LOGGING
		peer_log(peer_log_alert::outgoing_message, "HAVE", "piece: %d"
			, static_cast<int>(index));
#endif
		write_have(index);
#if TORRENT_USE_ASSERTS
		auto t = m_torrent.lock();
		TORRENT_ASSERT(t);
#endif
	}